

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPublicKey.cpp
# Opt level: O0

ByteString * __thiscall EDPublicKey::serialise(EDPublicKey *this)

{
  ByteString *in_RDI;
  ByteString *in_stack_ffffffffffffffa0;
  ByteString *in_stack_ffffffffffffffa8;
  ByteString *in_stack_ffffffffffffffc8;
  
  ByteString::serialise(in_stack_ffffffffffffffc8);
  ByteString::serialise(in_stack_ffffffffffffffc8);
  operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ByteString::~ByteString((ByteString *)0x14ff2c);
  ByteString::~ByteString((ByteString *)0x14ff36);
  return in_RDI;
}

Assistant:

ByteString EDPublicKey::serialise() const
{
	return ec.serialise() +
	       a.serialise();
}